

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall FfsParser::parseRawSectionBody(FfsParser *this,UModelIndex *index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TreeModel *pTVar3;
  int iVar4;
  USTATUS UVar5;
  CBString *this_00;
  CBString str;
  UByteArray parentFileGuid;
  UModelIndex parentFile;
  UByteArray local_b0;
  CBString local_90;
  CBString local_78;
  UByteArray local_60;
  UModelIndex local_40;
  
  if (index->r < 0) {
    return 1;
  }
  if (index->c < 0) {
    return 1;
  }
  if (index->m == (TreeModel *)0x0) {
    return 1;
  }
  TreeModel::findParentOfType(&local_40,this->model,index,'B');
  if (local_40.r < 0) {
    return 0x29;
  }
  if (local_40.c < 0) {
    return 0x29;
  }
  if (local_40.m == (TreeModel *)0x0) {
    return 0x29;
  }
  TreeModel::header(&local_b0,this->model,&local_40);
  paVar1 = &local_60.d.field_2;
  local_60.d._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,local_b0.d._M_dataplus._M_p,local_b0.d._M_dataplus._M_p + 0x10);
  paVar2 = &local_b0.d.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.d._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0.d._M_dataplus._M_p);
  }
  if ((local_60.d._M_string_length == EFI_PEI_APRIORI_FILE_GUID.d._M_string_length) &&
     ((local_60.d._M_string_length == 0 ||
      (iVar4 = bcmp(local_60.d._M_dataplus._M_p,EFI_PEI_APRIORI_FILE_GUID.d._M_dataplus._M_p,
                    local_60.d._M_string_length), iVar4 == 0)))) {
    pTVar3 = this->model;
    Bstrlib::CBString::CBString((CBString *)&local_b0,"PEI apriori file");
    TreeModel::setText(pTVar3,&local_40,(CBString *)&local_b0);
    Bstrlib::CBString::~CBString((CBString *)&local_b0);
    Bstrlib::CBString::CBString(&local_90);
    TreeModel::body(&local_b0,this->model,index);
    parseAprioriRawSection(this,&local_b0,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.d._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0.d._M_dataplus._M_p);
    }
    if (local_90.super_tagbstring.slen != 0) {
      pTVar3 = this->model;
      Bstrlib::CBString::CBString(&local_78,"\nFile list:");
      Bstrlib::CBString::operator+((CBString *)&local_b0,&local_78,&local_90);
      TreeModel::addInfo(pTVar3,index,(CBString *)&local_b0,true);
LAB_00123291:
      Bstrlib::CBString::~CBString((CBString *)&local_b0);
      Bstrlib::CBString::~CBString(&local_78);
    }
LAB_001232a5:
    this_00 = &local_90;
  }
  else {
    if ((local_60.d._M_string_length == EFI_DXE_APRIORI_FILE_GUID.d._M_string_length) &&
       ((local_60.d._M_string_length == 0 ||
        (iVar4 = bcmp(local_60.d._M_dataplus._M_p,EFI_DXE_APRIORI_FILE_GUID.d._M_dataplus._M_p,
                      local_60.d._M_string_length), iVar4 == 0)))) {
      pTVar3 = this->model;
      Bstrlib::CBString::CBString((CBString *)&local_b0,"DXE apriori file");
      TreeModel::setText(pTVar3,&local_40,(CBString *)&local_b0);
      Bstrlib::CBString::~CBString((CBString *)&local_b0);
      Bstrlib::CBString::CBString(&local_90);
      TreeModel::body(&local_b0,this->model,index);
      parseAprioriRawSection(this,&local_b0,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.d._M_dataplus._M_p != paVar2) {
        operator_delete(local_b0.d._M_dataplus._M_p);
      }
      if (local_90.super_tagbstring.slen != 0) {
        pTVar3 = this->model;
        Bstrlib::CBString::CBString(&local_78,"\nFile list:");
        Bstrlib::CBString::operator+((CBString *)&local_b0,&local_78,&local_90);
        TreeModel::addInfo(pTVar3,index,(CBString *)&local_b0,true);
        goto LAB_00123291;
      }
      goto LAB_001232a5;
    }
    if ((local_60.d._M_string_length != NVRAM_NVAR_EXTERNAL_DEFAULTS_FILE_GUID.d._M_string_length)
       || ((local_60.d._M_string_length != 0 &&
           (iVar4 = bcmp(local_60.d._M_dataplus._M_p,
                         NVRAM_NVAR_EXTERNAL_DEFAULTS_FILE_GUID.d._M_dataplus._M_p,
                         local_60.d._M_string_length), iVar4 != 0)))) {
      if ((local_60.d._M_string_length ==
           PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_AMI.d._M_string_length) &&
         ((local_60.d._M_string_length == 0 ||
          (iVar4 = bcmp(local_60.d._M_dataplus._M_p,
                        PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_AMI.d._M_dataplus._M_p,
                        local_60.d._M_string_length), iVar4 == 0)))) {
        UVar5 = parseVendorHashFile(this,&local_60,index);
      }
      else {
        UVar5 = parseRawArea(this,index);
      }
      goto LAB_001232f4;
    }
    pTVar3 = this->model;
    Bstrlib::CBString::CBString((CBString *)&local_b0,"NVRAM external defaults");
    TreeModel::setText(pTVar3,&local_40,(CBString *)&local_b0);
    this_00 = (CBString *)&local_b0;
  }
  Bstrlib::CBString::~CBString(this_00);
  UVar5 = 0;
LAB_001232f4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.d._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.d._M_dataplus._M_p);
  }
  return UVar5;
}

Assistant:

std::vector<std::pair<std::vector<UString>, UModelIndex> > FfsParser::getFitTable() const
{
    return fitParser->getFitTable();
}